

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

void __thiscall
ArgsManager::logArgsPrefix
          (ArgsManager *this,string *prefix,string *section,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          *args)

{
  long lVar1;
  size_type sVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  optional<unsigned_int> oVar6;
  _Rb_tree_node_base *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  string value_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string section_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = section->_M_string_length;
  if (sVar2 == 0) {
    section_str._M_dataplus._M_p = (pointer)&section_str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&section_str,"");
  }
  else {
    std::operator+(&local_78,"[",section);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_78,"] ");
    section_str._M_dataplus._M_p = (pointer)&section_str.field_2;
    pcVar3 = (pbVar5->_M_dataplus)._M_p;
    paVar8 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar8) {
      section_str.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      section_str.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      section_str.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      section_str._M_dataplus._M_p = pcVar3;
    }
    section_str._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
  }
  if ((sVar2 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  p_Var7 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(args->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var10) {
    paVar8 = &value_str.field_2;
    do {
      p_Var9 = *(_Base_ptr *)(p_Var7 + 2);
      p_Var4 = p_Var7[2]._M_parent;
      if (p_Var9 != p_Var4) {
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_str,'-',
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var7 + 1));
          oVar6 = GetArgFlags(this,&value_str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value_str._M_dataplus._M_p != paVar8) {
            operator_delete(value_str._M_dataplus._M_p,value_str.field_2._M_allocated_capacity + 1);
          }
          if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
            if ((oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload >> 10 & 1) == 0) {
              UniValue::write_abi_cxx11_((UniValue *)&value_str,(int)p_Var9,(void *)0x0,0);
            }
            else {
              value_str._M_dataplus._M_p = (pointer)paVar8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&value_str,"****","");
            }
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
            ;
            source_file._M_len = 0x5f;
            logging_function._M_str = "logArgsPrefix";
            logging_function._M_len = 0xd;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (logging_function,source_file,0x351,ALL,Info,
                       (ConstevalFormatString<4U>)0x18a8e1,prefix,&section_str,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &value_str);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)value_str._M_dataplus._M_p != paVar8) {
              operator_delete(value_str._M_dataplus._M_p,value_str.field_2._M_allocated_capacity + 1
                             );
            }
          }
          p_Var9 = (_Base_ptr)&p_Var9[2]._M_right;
        } while (p_Var9 != p_Var4);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var10);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)section_str._M_dataplus._M_p != &section_str.field_2) {
    operator_delete(section_str._M_dataplus._M_p,section_str.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::logArgsPrefix(
    const std::string& prefix,
    const std::string& section,
    const std::map<std::string, std::vector<common::SettingsValue>>& args) const
{
    std::string section_str = section.empty() ? "" : "[" + section + "] ";
    for (const auto& arg : args) {
        for (const auto& value : arg.second) {
            std::optional<unsigned int> flags = GetArgFlags('-' + arg.first);
            if (flags) {
                std::string value_str = (*flags & SENSITIVE) ? "****" : value.write();
                LogPrintf("%s %s%s=%s\n", prefix, section_str, arg.first, value_str);
            }
        }
    }
}